

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD3Importer::SetupProperties(MD3Importer *this,Importer *pImp)

{
  Importer *pIVar1;
  uint uVar2;
  int iVar3;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  allocator<char> local_59;
  string local_58;
  string local_38;
  Importer *local_18;
  Importer *pImp_local;
  MD3Importer *this_local;
  
  local_18 = pImp;
  pImp_local = (Importer *)this;
  uVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MD3_KEYFRAME",-1);
  this->configFrameID = uVar2;
  if (this->configFrameID == 0xffffffff) {
    uVar2 = Importer::GetPropertyInteger(local_18,"IMPORT_GLOBAL_KEYFRAME",0);
    this->configFrameID = uVar2;
  }
  iVar3 = Importer::GetPropertyInteger(local_18,"IMPORT_MD3_HANDLE_MULTIPART",1);
  pIVar1 = local_18;
  this->configHandleMP = iVar3 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"default",&local_59);
  Importer::GetPropertyString(&local_38,pIVar1,"IMPORT_MD3_SKIN_NAME",&local_58);
  std::__cxx11::string::operator=((string *)&this->configSkinFile,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pIVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
  Importer::GetPropertyString(&local_90,pIVar1,"IMPORT_MD3_SHADER_SRC",&local_b0);
  std::__cxx11::string::operator=((string *)&this->configShaderFile,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  iVar3 = Importer::GetPropertyInteger(local_18,"FAVOUR_SPEED",0);
  this->configSpeedFlag = iVar3 != 0;
  return;
}

Assistant:

void MD3Importer::SetupProperties(const Importer* pImp)
{
    // The
    // AI_CONFIG_IMPORT_MD3_KEYFRAME option overrides the
    // AI_CONFIG_IMPORT_GLOBAL_KEYFRAME option.
    configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_MD3_KEYFRAME,-1);
    if(static_cast<unsigned int>(-1) == configFrameID) {
        configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_GLOBAL_KEYFRAME,0);
    }

    // AI_CONFIG_IMPORT_MD3_HANDLE_MULTIPART
    configHandleMP = (0 != pImp->GetPropertyInteger(AI_CONFIG_IMPORT_MD3_HANDLE_MULTIPART,1));

    // AI_CONFIG_IMPORT_MD3_SKIN_NAME
    configSkinFile = (pImp->GetPropertyString(AI_CONFIG_IMPORT_MD3_SKIN_NAME,"default"));

    // AI_CONFIG_IMPORT_MD3_SHADER_SRC
    configShaderFile = (pImp->GetPropertyString(AI_CONFIG_IMPORT_MD3_SHADER_SRC,""));

    // AI_CONFIG_FAVOUR_SPEED
    configSpeedFlag = (0 != pImp->GetPropertyInteger(AI_CONFIG_FAVOUR_SPEED,0));
}